

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  ostream *poVar1;
  Detail *pDVar2;
  ostringstream oss;
  char in_stack_fffffffffffffe2f;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"{ ");
  if (this != (Detail *)first._M_current) {
    Catch::toString_abi_cxx11_(in_stack_fffffffffffffe2f);
    std::operator<<((ostream *)local_1a8,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    for (pDVar2 = this + 1; pDVar2 != (Detail *)first._M_current; pDVar2 = pDVar2 + 1) {
      poVar1 = std::operator<<((ostream *)local_1a8,", ");
      Catch::toString_abi_cxx11_(in_stack_fffffffffffffe2f);
      std::operator<<(poVar1,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
  }
  std::operator<<((ostream *)local_1a8," }");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString( InputIterator first, InputIterator last ) {
        std::ostringstream oss;
        oss << "{ ";
        if( first != last ) {
            oss << Catch::toString( *first );
            for( ++first ; first != last ; ++first )
                oss << ", " << Catch::toString( *first );
        }
        oss << " }";
        return oss.str();
    }